

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_posix.c
# Opt level: O1

int thread_join(thread_handle *pt)

{
  pthread_t *ppVar1;
  int iVar2;
  int iVar3;
  
  ppVar1 = (pthread_t *)pt->priv;
  mutex_lock((mutex_handle *)(ppVar1 + 1));
  if ((char)ppVar1[2] != '\0') {
    iVar3 = pthread_join(*ppVar1,(void **)0x0);
    *(undefined1 *)(ppVar1 + 2) = 0;
    if (iVar3 != 0) goto LAB_001080eb;
    *ppVar1 = 0;
  }
  iVar3 = 0;
LAB_001080eb:
  mutex_unlock((mutex_handle *)(ppVar1 + 1));
  iVar2 = -iVar3;
  if (iVar3 < 1) {
    iVar2 = iVar3;
  }
  return iVar2;
}

Assistant:

int thread_join(struct thread_handle *pt)
{
	struct thread_priv *priv = pt->priv;
	int ret;

	mutex_lock(&priv->mutex);

	if (!priv->dirty) {
		ret = 0;
	} else {
		ret = pthread_join(priv->thread, NULL);

		priv->dirty = 0;

		if (ret == 0)
			memset(&priv->thread, 0x0, sizeof(priv->thread));
	}

	mutex_unlock(&priv->mutex);

	return ret > 0 ? -ret : ret;
}